

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

int countint(TValue *key,int *nums)

{
  bool bVar1;
  uint x;
  int iVar2;
  
  x = arrayindex(key);
  bVar1 = x - 1 < 0x40000000;
  if (bVar1) {
    iVar2 = luaO_ceillog2(x);
    nums[iVar2] = nums[iVar2] + 1;
  }
  return (uint)bVar1;
}

Assistant:

static int countint (const TValue *key, int *nums) {
  int k = arrayindex(key);
  if (0 < k && k <= MAXASIZE) {  /* is `key' an appropriate array index? */
    nums[luaO_ceillog2(k)]++;  /* count as such */
    return 1;
  }
  else
    return 0;
}